

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::inverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  invalid_argument *this_00;
  int i;
  long lVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 local_38;
  float fStack_30;
  float fStack_2c;
  float fStack_28;
  float fStack_24;
  undefined8 uStack_20;
  float local_18;
  
  puVar7 = &local_38;
  puVar8 = &local_38;
  fVar12 = this->x[0][2];
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    fVar13 = this->x[1][2];
  }
  else {
    fVar13 = this->x[1][2];
    if ((((fVar13 == 0.0) && (!NAN(fVar13))) && (fVar1 = this->x[2][2], fVar1 == 1.0)) &&
       (!NAN(fVar1))) {
      fVar12 = this->x[1][1];
      fStack_28 = this->x[0][0];
      fVar13 = this->x[0][1];
      fVar1 = this->x[1][0];
      local_38 = CONCAT44(fVar13,fVar12) ^ 0x8000000000000000;
      fStack_30 = 0.0;
      fStack_2c = -fVar1;
      fStack_24 = 0.0;
      local_18 = 1.0;
      fVar13 = fStack_28 * fVar12 - fVar13 * fVar1;
      fVar12 = fVar13;
      if (fVar13 <= -fVar13) {
        fVar12 = -fVar13;
      }
      if (1.0 <= fVar12) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_38;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = CONCAT44(fStack_28,fVar1) ^ 0x80000000;
        auVar16._4_4_ = fVar13;
        auVar16._0_4_ = fVar13;
        auVar16._8_4_ = fVar13;
        auVar16._12_4_ = fVar13;
        auVar16 = divps(auVar15,auVar16);
        local_38 = auVar16._0_8_;
        auVar4._4_4_ = fVar13;
        auVar4._0_4_ = fVar13;
        auVar4._8_4_ = fVar13;
        auVar4._12_4_ = fVar13;
        auVar16 = divps(auVar17,auVar4);
        fStack_2c = auVar16._0_4_;
        fStack_28 = auVar16._4_4_;
      }
      else {
        lVar9 = 0;
        bVar5 = true;
        do {
          bVar6 = bVar5;
          lVar9 = lVar9 * 0xc + -0x38;
          lVar10 = 0;
          bVar5 = true;
          do {
            bVar11 = bVar5;
            fVar1 = *(float *)((long)&local_38 + lVar10 * 4 + lVar9 + 0x38);
            fVar20 = fVar1;
            if (fVar1 <= -fVar1) {
              fVar20 = -fVar1;
            }
            if (fVar12 * 8.507059e+37 <= fVar20) {
              if (!singExc) goto LAB_00143b7d;
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
              goto LAB_00143d1c;
            }
            *(float *)((long)&local_38 + lVar10 * 4 + lVar9 + 0x38) = fVar1 / fVar13;
            lVar10 = 1;
            bVar5 = false;
          } while (bVar11);
          lVar9 = 1;
          bVar5 = false;
        } while (bVar6);
      }
      fVar12 = this->x[2][0];
      fVar13 = this->x[2][1];
      __return_storage_ptr__->x[0][0] = (float)local_38;
      __return_storage_ptr__->x[0][1] = local_38._4_4_;
      __return_storage_ptr__->x[0][2] = fStack_30;
      __return_storage_ptr__->x[1][0] = fStack_2c;
      __return_storage_ptr__->x[1][1] = fStack_28;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[2][0] = -fVar12 * (float)local_38 - fVar13 * fStack_2c;
      __return_storage_ptr__->x[2][1] = -fVar12 * local_38._4_4_ - fVar13 * fStack_28;
      goto LAB_00143b94;
    }
  }
  uVar3 = *(undefined8 *)(this->x[2] + 1);
  fVar18 = (float)uVar3;
  fVar19 = (float)((ulong)uVar3 >> 0x20);
  fVar1 = this->x[0][1];
  uVar3 = *(undefined8 *)this->x[1];
  fVar21 = (float)uVar3;
  fVar23 = (float)((ulong)uVar3 >> 0x20);
  fVar20 = this->x[2][0];
  fVar2 = this->x[0][0];
  fVar22 = fVar23 * fVar19 - fVar13 * fVar18;
  fStack_2c = fVar13 * fVar20 - fVar19 * fVar21;
  local_38 = CONCAT44(fVar12 * fVar18 - fVar19 * fVar1,fVar22);
  fStack_30 = fVar13 * fVar1 - fVar12 * fVar23;
  auVar14._0_4_ = fVar2 * fVar19 - fVar12 * fVar20;
  auVar14._4_4_ = fVar12 * fVar21 - fVar13 * fVar2;
  auVar14._8_4_ = fVar21 * fVar18 - fVar23 * fVar20;
  auVar14._12_4_ = fVar1 * fVar20 - fVar18 * fVar2;
  fStack_28 = auVar14._0_4_;
  fStack_24 = auVar14._4_4_;
  uStack_20 = auVar14._8_8_;
  local_18 = fVar23 * fVar2 + -fVar21 * fVar1;
  fVar13 = auVar14._8_4_ * fVar12 + fStack_2c * fVar1 + fVar2 * fVar22;
  fVar12 = fVar13;
  if (fVar13 <= -fVar13) {
    fVar12 = -fVar13;
  }
  if (1.0 <= fVar12) {
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        *(float *)((long)puVar8 + lVar10 * 4) = *(float *)((long)puVar8 + lVar10 * 4) / fVar13;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar9 = lVar9 + 1;
      puVar8 = (undefined8 *)((long)puVar8 + 0xc);
    } while (lVar9 != 3);
  }
  else {
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        fVar1 = *(float *)((long)puVar7 + lVar10 * 4);
        fVar20 = fVar1;
        if (fVar1 <= -fVar1) {
          fVar20 = -fVar1;
        }
        if (fVar12 * 8.507059e+37 <= fVar20) {
          if (singExc) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_00143d1c:
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
LAB_00143b7d:
          *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
          *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
          *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
          *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
          *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
          *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
          *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
          local_18 = 1.0;
          goto LAB_00143b94;
        }
        *(float *)((long)puVar7 + lVar10 * 4) = fVar1 / fVar13;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = (undefined8 *)((long)puVar7 + 0xc);
    } while (lVar9 != 3);
  }
  *(ulong *)__return_storage_ptr__->x[0] = local_38;
  *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(fStack_2c,fStack_30);
  *(ulong *)(__return_storage_ptr__->x[1] + 1) = CONCAT44(fStack_24,fStack_28);
  *(undefined8 *)__return_storage_ptr__->x[2] = uStack_20;
LAB_00143b94:
  __return_storage_ptr__->x[2][2] = local_18;
  return __return_storage_ptr__;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix33<T>
Matrix33<T>::inverse (bool singExc) const
{
    if (x[0][2] != 0 || x[1][2] != 0 || x[2][2] != 1)
    {
        Matrix33 s (
            x[1][1] * x[2][2] - x[2][1] * x[1][2],
            x[2][1] * x[0][2] - x[0][1] * x[2][2],
            x[0][1] * x[1][2] - x[1][1] * x[0][2],

            x[2][0] * x[1][2] - x[1][0] * x[2][2],
            x[0][0] * x[2][2] - x[2][0] * x[0][2],
            x[1][0] * x[0][2] - x[0][0] * x[1][2],

            x[1][0] * x[2][1] - x[2][0] * x[1][1],
            x[2][0] * x[0][1] - x[0][0] * x[2][1],
            x[0][0] * x[1][1] - x[1][0] * x[0][1]);

        T r = x[0][0] * s[0][0] + x[0][1] * s[1][0] + x[0][2] * s[2][0];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 3; ++i)
            {
                for (int j = 0; j < 3; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        return s;
    }
    else
    {
        Matrix33 s (
            x[1][1],
            -x[0][1],
            0,

            -x[1][0],
            x[0][0],
            0,

            0,
            0,
            1);

        T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

        if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
        {
            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    s.x[i][j] /= r;
                }
            }
        }
        else
        {
            T mr = IMATH_INTERNAL_NAMESPACE::abs (r) /
                   std::numeric_limits<T>::min ();

            for (int i = 0; i < 2; ++i)
            {
                for (int j = 0; j < 2; ++j)
                {
                    if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                    {
                        s.x[i][j] /= r;
                    }
                    else
                    {
                        if (singExc)
                            throw std::invalid_argument ("Cannot invert "
                                                         "singular matrix.");
                        return Matrix33 ();
                    }
                }
            }
        }

        s.x[2][0] = -x[2][0] * s.x[0][0] - x[2][1] * s.x[1][0];
        s.x[2][1] = -x[2][0] * s.x[0][1] - x[2][1] * s.x[1][1];

        return s;
    }
}